

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_kv_cursor_next_entry(unqlite_kv_cursor *pCursor)

{
  _func_int_unqlite_kv_cursor_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = pCursor->pStore->pIo->pMethods->xNext;
  if (UNRECOVERED_JUMPTABLE != (_func_int_unqlite_kv_cursor_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(pCursor);
    return iVar1;
  }
  return -0x11;
}

Assistant:

int unqlite_kv_cursor_next_entry(unqlite_kv_cursor *pCursor)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	/* Check if the requested method is implemented by the underlying storage engine */
	if( pCursor->pStore->pIo->pMethods->xNext == 0 ){
		rc = UNQLITE_NOTIMPLEMENTED;
	}else{
		/* Seek to the next entry */
		rc = pCursor->pStore->pIo->pMethods->xNext(pCursor);
	}
	return rc;
}